

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *itemFormat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar4;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar3;
    (this->Name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->Supported = true;
  (this->Prefix)._M_dataplus._M_p = (pointer)&(this->Prefix).field_2;
  (this->Prefix)._M_string_length = 0;
  (this->Prefix).field_2._M_local_buf[0] = '\0';
  (this->Suffix)._M_dataplus._M_p = (pointer)&(this->Suffix).field_2;
  (this->Suffix)._M_string_length = 0;
  (this->Suffix).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->ItemPathFormat).field_2;
  (this->ItemPathFormat)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (itemFormat->_M_dataplus)._M_p;
  paVar2 = &itemFormat->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&itemFormat->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ItemPathFormat).field_2 + 8) = uVar4;
  }
  else {
    (this->ItemPathFormat)._M_dataplus._M_p = pcVar3;
    (this->ItemPathFormat).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ItemPathFormat)._M_string_length = itemFormat->_M_string_length;
  (itemFormat->_M_dataplus)._M_p = (pointer)paVar2;
  itemFormat->_M_string_length = 0;
  (itemFormat->field_2)._M_local_buf[0] = '\0';
  (this->ItemNameFormat)._M_dataplus._M_p = (pointer)&(this->ItemNameFormat).field_2;
  pcVar3 = (this->ItemPathFormat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ItemNameFormat,pcVar3,pcVar3 + (this->ItemPathFormat)._M_string_length
            );
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string itemFormat)
  : Name(std::move(name))
  , Supported(true)
  , ItemPathFormat(std::move(itemFormat))
  , ItemNameFormat(this->ItemPathFormat)
{
}